

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZTensor<double>::dJ3(TPZTensor<double> *this,TPZTensor<double> *deriv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  
  pdVar4 = (this->fData).super_TPZVec<double>.fStore;
  dVar9 = *pdVar4;
  dVar1 = pdVar4[3];
  dVar2 = pdVar4[5];
  dVar6 = pdVar4[1];
  dVar7 = pdVar4[2];
  dVar8 = pdVar4[4];
  dVar13 = (dVar9 * dVar6) / 3.0;
  auVar12._0_8_ = dVar1 * dVar6;
  auVar12._8_8_ = dVar6 * dVar2 * 2.0;
  auVar11 = divpd(auVar12,_DAT_01501610);
  auVar14._0_8_ = dVar2 * dVar7;
  auVar14._8_8_ = dVar7 * dVar1 * 2.0;
  auVar15 = divpd(auVar14,_DAT_01501610);
  pdVar5 = (deriv->fData).super_TPZVec<double>.fStore;
  dVar18 = (dVar9 * dVar7) / 3.0;
  *pdVar5 = (((((((dVar7 * dVar7) / 3.0 +
                 (dVar6 * dVar6) / 3.0 + (dVar9 * dVar9 + dVar9 * dVar9) / 9.0) -
                (dVar9 * dVar1 + dVar9 * dVar1) / 9.0) - (dVar1 * dVar1) / 9.0) -
              (dVar8 * dVar8 + dVar8 * dVar8) / 3.0) - (dVar9 * dVar2 + dVar9 * dVar2) / 9.0) +
            (dVar1 * dVar2 * 4.0) / 9.0) - (dVar2 * dVar2) / 9.0;
  pdVar5[1] = dVar7 * dVar8 +
              dVar8 * dVar7 +
              ((((dVar13 + auVar11._0_8_) - auVar11._8_8_) + dVar13 + auVar11._0_8_) - auVar11._8_8_
              );
  pdVar5[2] = dVar6 * dVar8 +
              ((dVar6 * dVar8 + (dVar18 - auVar15._8_8_) + auVar15._0_8_ + dVar18) - auVar15._8_8_)
              + auVar15._0_8_;
  dVar13 = *pdVar4;
  auVar15._0_8_ = -dVar13 * dVar13;
  auVar15._8_8_ = pdVar4[2] * pdVar4[2] * 2.0;
  auVar15 = divpd(auVar15,_DAT_01501630);
  dVar18 = pdVar4[3];
  auVar17._0_8_ = dVar18 * dVar18 + dVar18 * dVar18;
  auVar17._8_8_ = dVar18 * dVar13 + dVar18 * dVar13;
  auVar12 = divpd(auVar17,_DAT_01501640);
  dVar3 = pdVar4[5];
  auVar16._0_8_ = dVar13 * dVar3 * 4.0;
  auVar16._8_8_ = pdVar4[4] * pdVar4[4];
  auVar17 = divpd(auVar16,_DAT_01501630);
  auVar11._0_8_ = dVar18 * dVar3 * 2.0;
  auVar11._8_8_ = dVar8 * dVar1;
  dVar9 = (dVar9 * dVar8 + dVar9 * dVar8) / 3.0;
  auVar11 = divpd(auVar11,_DAT_01501630);
  auVar10._0_8_ = dVar3 * dVar3;
  auVar10._8_8_ = dVar2 * dVar8;
  auVar10 = divpd(auVar10,_DAT_01501630);
  pdVar5[3] = ((auVar17._8_8_ +
                ((((pdVar4[1] * pdVar4[1]) / 3.0 + auVar15._0_8_) - auVar15._8_8_) - auVar12._8_8_)
                + auVar12._0_8_ + auVar17._0_8_) - auVar11._0_8_) - auVar10._0_8_;
  pdVar5[4] = ((auVar10._8_8_ + (auVar11._8_8_ - dVar9) + dVar7 * dVar6 + dVar7 * dVar6) - dVar9) +
              auVar11._8_8_ + auVar10._8_8_;
  dVar9 = *pdVar4;
  dVar8 = pdVar4[1] * pdVar4[1];
  dVar1 = pdVar4[3];
  dVar2 = pdVar4[5];
  pdVar5[5] = (dVar2 * dVar2 + dVar2 * dVar2) / 9.0 +
              ((((pdVar4[4] * pdVar4[4]) / 3.0 +
                (((dVar9 * dVar1 * 4.0) / 9.0 +
                 (pdVar4[2] * pdVar4[2]) / 3.0 + ((-dVar9 * dVar9) / 9.0 - (dVar8 + dVar8) / 3.0)) -
                (dVar1 * dVar1) / 9.0)) - (dVar9 * dVar2 + dVar9 * dVar2) / 9.0) -
              (dVar1 * dVar2 + dVar1 * dVar2) / 9.0);
  return;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}